

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O2

bdecode_node * __thiscall
libtorrent::bdecode(bdecode_node *__return_storage_ptr__,libtorrent *this,span<const_char> buffer,
                   error_code *ec,int *error_pos,int depth_limit,int token_limit)

{
  undefined8 uVar1;
  long lVar2;
  vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  *pvVar3;
  error_code_enum eVar4;
  libtorrent *plVar5;
  bdecode_token bVar6;
  libtorrent *start;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  error_code_enum eVar11;
  int iVar12;
  error_code *peVar13;
  pointer pbVar14;
  libtorrent lVar15;
  int iVar16;
  char *pcVar17;
  int iVar18;
  long lVar19;
  libtorrent *plVar20;
  uint uVar21;
  ulong uVar22;
  libtorrent *plVar23;
  libtorrent *end;
  undefined8 uStack_a0;
  bdecode_token local_98;
  char *local_90;
  bdecode_token local_88;
  error_code_enum local_7c;
  libtorrent *plStack_78;
  error_code_enum e;
  libtorrent *local_70;
  long local_68;
  int local_60;
  uint local_5c;
  bdecode_token local_58;
  int64_t len;
  error_code *local_48;
  ulong local_40;
  libtorrent *local_38;
  
  peVar13 = (error_code *)buffer.m_len;
  pcVar17 = buffer.m_ptr;
  local_38 = this;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->m_root_tokens + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(__return_storage_ptr__->m_tokens).
    super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
    .
    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  pvVar3 = &(__return_storage_ptr__->m_tokens).
            super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  ;
  (pvVar3->
  super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar3->
  super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->m_token_idx = -1;
  __return_storage_ptr__->m_last_index = -1;
  __return_storage_ptr__->m_last_token = -1;
  __return_storage_ptr__->m_size = -1;
  peVar13->val_ = 0;
  peVar13->failed_ = false;
  peVar13->cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  if ((long)pcVar17 < 0x20000000) {
    uVar9 = (uint)error_pos;
    lVar2 = -((long)(int)uVar9 * 4 + 0xfU & 0xfffffffffffffff0);
    local_68 = (long)&local_98 + lVar2;
    for (lVar19 = 0; (long)(int)uVar9 * 4 != lVar19; lVar19 = lVar19 + 4) {
      *(undefined4 *)((long)&local_98 + lVar2 + lVar19) = 0;
    }
    local_88 = (bdecode_token)0x1a0000000;
    if (pcVar17 == (char *)0x0) {
      *(undefined8 *)((long)&uStack_a0 + lVar2) = 3;
      uVar1 = *(undefined8 *)((long)&uStack_a0 + lVar2);
      *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18a3ce;
      boost::system::error_code::operator=(peVar13,(error_code_enum)uVar1);
      start = local_38;
      uVar22 = 0;
      if (ec != (error_code *)0x0) {
        ec->val_ = 0;
      }
    }
    else {
      local_48 = peVar13;
      len = (int64_t)ec;
      local_90 = pcVar17;
      uVar10 = 0;
      plStack_78 = this + (long)pcVar17;
      local_5c = uVar9;
      do {
        end = plStack_78;
        uVar22 = (ulong)uVar10;
        start = this;
        if (plStack_78 < this) goto LAB_0018a503;
        iVar12 = (int)this;
        if (plStack_78 <= this) {
          *(undefined8 *)((long)&uStack_a0 + lVar2) = 3;
LAB_0018a441:
          peVar13 = local_48;
          uVar1 = *(undefined8 *)((long)&uStack_a0 + lVar2);
          *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18a44b;
          boost::system::error_code::operator=(peVar13,(error_code_enum)uVar1);
LAB_0018a44b:
          if (len != 0) {
            *(int *)len = iVar12 - (int)local_38;
          }
          goto LAB_0018a503;
        }
        if ((int)error_pos <= (int)uVar10) {
          *(undefined8 *)((long)&uStack_a0 + lVar2) = 5;
          goto LAB_0018a441;
        }
        if (depth_limit < 1) {
          *(undefined8 *)((long)&uStack_a0 + lVar2) = 6;
          goto LAB_0018a441;
        }
        lVar15 = *this;
        plVar20 = (libtorrent *)(ulong)uVar10;
        if ((((0 < (int)uVar10) &&
             (uVar9 = *(uint *)(local_68 + -4 + (long)plVar20 * 4), -1 < (int)uVar9)) &&
            ((SUB84((__return_storage_ptr__->m_tokens).
                    super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    .
                    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar9 & 0x7fffffff],0) & 0xe0000000)
             == 0x20000000)) && (lVar15 != (libtorrent)0x65 && 9 < (byte)((char)lVar15 - 0x30U))) {
          *(undefined8 *)((long)&uStack_a0 + lVar2) = 1;
          goto LAB_0018a441;
        }
        if (8 < (byte)lVar15 - 100) {
switchD_0018a061_caseD_66:
          bVar6._0_1_ = (char)lVar15 - 0x30;
          if (9 < bVar6._0_1_) {
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 4;
            goto LAB_0018a441;
          }
          local_40 = uVar22;
          bVar6._1_7_ = 0;
          local_58 = bVar6;
          start = this + 1;
          if (plStack_78 <= start) {
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 3;
            peVar13 = local_48;
            uVar1 = *(undefined8 *)((long)&uStack_a0 + lVar2);
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18a476;
            boost::system::error_code::operator=(peVar13,(error_code_enum)uVar1);
            uVar22 = local_40;
            if (len != 0) {
              *(int *)len = (int)start - (int)local_38;
            }
            goto LAB_0018a503;
          }
          local_70 = plVar20;
          local_7c = no_error;
          *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x3a;
          uVar1 = *(undefined8 *)((long)&uStack_a0 + lVar2);
          *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18a2bf;
          start = (libtorrent *)
                  parse_int((char *)start,(char *)end,(char)uVar1,(int64_t *)&local_58,&local_7c);
          bVar6 = local_58;
          eVar11 = local_7c;
          if (local_7c == no_error) {
            if (start != end) {
              if ((long)(end + ~(ulong)start) < (long)local_58) {
                *(undefined8 *)((long)&uStack_a0 + lVar2) = 3;
              }
              else if ((long)local_58 < 0) {
                *(undefined8 *)((long)&uStack_a0 + lVar2) = 7;
              }
              else {
                start = start + 1;
                if ((long)start - (long)this < 10) {
                  local_98 = (bdecode_token)
                             (((long)start - (long)this << 0x3d) + 0xc000000000000000U |
                             (ulong)(iVar12 - (int)local_38 & 0x1fffffff) | 0x160000000);
                  local_60 = depth_limit;
                  *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18a359;
                  std::
                  vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                  ::emplace_back<libtorrent::detail::bdecode_token>
                            ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                              *)__return_storage_ptr__,&local_98);
                  start = start + (long)bVar6;
                  error_pos = (int *)(ulong)local_5c;
                  plVar20 = local_70;
                  uVar9 = (uint)local_40;
                  uVar21 = (uint)local_40;
                  goto LAB_0018a372;
                }
                *(undefined8 *)((long)&uStack_a0 + lVar2) = 6;
              }
              eVar11 = (error_code_enum)*(undefined8 *)((long)&uStack_a0 + lVar2);
              goto LAB_0018a4d8;
            }
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 2;
            peVar13 = local_48;
            uVar1 = *(undefined8 *)((long)&uStack_a0 + lVar2);
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18a4b3;
            boost::system::error_code::operator=(peVar13,(error_code_enum)uVar1);
            iVar12 = (int)local_90;
            start = plStack_78;
            uVar22 = local_40;
            if (len == 0) goto LAB_0018a503;
          }
          else {
LAB_0018a4d8:
            peVar13 = local_48;
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18a4e1;
            boost::system::error_code::operator=(peVar13,eVar11);
            uVar22 = local_40;
            if (len == 0) goto LAB_0018a503;
            iVar12 = (int)start - (int)local_38;
          }
          *(int *)len = iVar12;
          uVar22 = local_40;
          goto LAB_0018a503;
        }
        lVar19 = (long)(int)uVar10;
        iVar16 = (int)local_38;
        switch((uint)(byte)lVar15) {
        case 100:
          *(uint *)(local_68 + lVar19 * 4) =
               (uint)((ulong)((long)(__return_storage_ptr__->m_tokens).
                                    super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                    .
                                    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(__return_storage_ptr__->m_tokens).
                                   super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                   .
                                   super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) & 0x7fffffff;
          local_58 = (bdecode_token)((ulong)(iVar12 - iVar16 & 0x1fffffff) | 0x20000000);
          local_60 = depth_limit;
          *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18a0a6;
          std::
          vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
          ::emplace_back<libtorrent::detail::bdecode_token>
                    ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                      *)__return_storage_ptr__,&local_58);
          break;
        case 0x65:
          if (uVar10 == 0) {
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 3;
            peVar13 = local_48;
            uVar1 = *(undefined8 *)((long)&uStack_a0 + lVar2);
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18a43a;
            boost::system::error_code::operator=(peVar13,(error_code_enum)uVar1);
            uVar22 = 0;
            goto LAB_0018a44b;
          }
          local_40 = uVar22;
          if ((((int)uVar10 < 1) ||
              (uVar9 = *(uint *)(local_68 + -4 + (long)plVar20 * 4), -1 < (int)uVar9)) ||
             ((SUB84((__return_storage_ptr__->m_tokens).
                     super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                     .
                     super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar9 & 0x7fffffff],0) & 0xe0000000)
              != 0x20000000)) {
            local_58 = (bdecode_token)((ulong)(iVar12 - iVar16 & 0x1fffffff) | 0x1a0000000);
            local_70 = this;
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18a1af;
            std::
            vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
            ::emplace_back<libtorrent::detail::bdecode_token>
                      ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                        *)__return_storage_ptr__,&local_58);
            uVar9 = *(uint *)(local_68 + -4 + lVar19 * 4);
            uVar10 = uVar9 & 0x7fffffff;
            pbVar14 = (__return_storage_ptr__->m_tokens).
                      super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                      .
                      super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar18 = (int)((ulong)((long)(__return_storage_ptr__->m_tokens).
                                         super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                         .
                                         super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14)
                          >> 3);
            uVar21 = (uint)local_40;
            if ((int)(iVar18 - uVar10) < 0x20000000) {
              local_60 = depth_limit;
              pbVar14[uVar10] =
                   (bdecode_token)
                   ((ulong)pbVar14[uVar10] & 0xe0000000ffffffff |
                   (ulong)(iVar18 - uVar9 & 0x1fffffff) << 0x20);
              start = local_70 + 1;
              error_pos = (int *)(ulong)local_5c;
              uVar9 = uVar21 - 1;
              goto LAB_0018a372;
            }
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 6;
            peVar13 = local_48;
            uVar1 = *(undefined8 *)((long)&uStack_a0 + lVar2);
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18a495;
            boost::system::error_code::operator=(peVar13,(error_code_enum)uVar1);
            start = local_70;
            uVar22 = local_40;
            if (len != 0) {
              *(int *)len = iVar12 - iVar16;
            }
          }
          else {
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 4;
            peVar13 = local_48;
            uVar1 = *(undefined8 *)((long)&uStack_a0 + lVar2);
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18a625;
            boost::system::error_code::operator=(peVar13,(error_code_enum)uVar1);
            uVar22 = local_40;
            if (len != 0) {
              *(int *)len = iVar12 - (int)local_38;
            }
          }
          goto LAB_0018a503;
        default:
          goto switchD_0018a061_caseD_66;
        case 0x69:
          plVar5 = this + 1;
          if (plVar5 != plStack_78) {
            lVar15 = *plVar5;
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 3;
            if (lVar15 == (libtorrent)0x2d) {
              plVar5 = this + 2;
              eVar11 = (error_code_enum)*(undefined8 *)((long)&uStack_a0 + lVar2);
              if (plVar5 == end) goto LAB_0018a400;
              lVar15 = *plVar5;
            }
            uVar9 = 0;
            start = plVar5 + 1;
            do {
              plVar23 = start;
              if (9 < (byte)((char)lVar15 - 0x30U)) {
                end = plVar23 + -1;
                iVar12 = -uVar9;
                *(undefined8 *)((long)&uStack_a0 + lVar2) = 1;
                eVar4 = (error_code_enum)*(undefined8 *)((long)&uStack_a0 + lVar2);
LAB_0018a3f7:
                *(undefined8 *)((long)&uStack_a0 + lVar2) = 7;
                eVar11 = (error_code_enum)*(undefined8 *)((long)&uStack_a0 + lVar2);
                if (iVar12 < 0x15) {
                  eVar11 = eVar4;
                }
                goto LAB_0018a400;
              }
              if (plVar23 == end) {
                iVar12 = (int)end - (int)plVar5;
                *(undefined8 *)((long)&uStack_a0 + lVar2) = 3;
                eVar4 = (error_code_enum)*(undefined8 *)((long)&uStack_a0 + lVar2);
                goto LAB_0018a3f7;
              }
              lVar15 = *plVar23;
              start = plVar23 + 1;
              uVar9 = uVar9 - 1;
            } while (lVar15 != (libtorrent)0x65);
            if (uVar9 < 0xffffffec) {
              *(undefined8 *)((long)&uStack_a0 + lVar2) = 7;
              end = plVar23;
              eVar11 = (error_code_enum)*(undefined8 *)((long)&uStack_a0 + lVar2);
              goto LAB_0018a400;
            }
            local_58 = (bdecode_token)((ulong)(iVar12 - (int)local_38 & 0x1fffffff) | 0x180000000);
            local_60 = depth_limit;
            *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18a139;
            std::
            vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
            ::emplace_back<libtorrent::detail::bdecode_token>
                      ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                        *)__return_storage_ptr__,&local_58);
            uVar9 = uVar10;
            goto LAB_0018a271;
          }
          *(undefined8 *)((long)&uStack_a0 + lVar2) = 3;
          eVar11 = (error_code_enum)*(undefined8 *)((long)&uStack_a0 + lVar2);
LAB_0018a400:
          peVar13 = local_48;
          if (len != 0) {
            *(int *)len = (int)end - (int)local_38;
          }
          *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18a419;
          boost::system::error_code::operator=(peVar13,eVar11);
          start = this;
          goto LAB_0018a503;
        case 0x6c:
          *(uint *)(local_68 + lVar19 * 4) =
               (uint)((ulong)((long)(__return_storage_ptr__->m_tokens).
                                    super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                    .
                                    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(__return_storage_ptr__->m_tokens).
                                   super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                   .
                                   super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) & 0x7fffffff;
          local_58 = (bdecode_token)((ulong)(iVar12 - iVar16 & 0x1fffffff) | 0x40000000);
          local_60 = depth_limit;
          *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18a267;
          std::
          vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
          ::emplace_back<libtorrent::detail::bdecode_token>
                    ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                      *)__return_storage_ptr__,&local_58);
        }
        start = this + 1;
        uVar9 = uVar10 + 1;
LAB_0018a271:
        error_pos = (int *)(ulong)local_5c;
        uVar21 = uVar10;
LAB_0018a372:
        uVar10 = uVar9;
        if ((0 < (int)uVar21) &&
           (uVar9 = *(uint *)(local_68 + -4 + (long)plVar20 * 4),
           ((ulong)(__return_storage_ptr__->m_tokens).
                   super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                   .
                   super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9 & 0x7fffffff] & 0xe0000000) ==
           0x20000000)) {
          *(uint *)(local_68 + -4 + (long)plVar20 * 4) = uVar9 + 0x80000000;
        }
        depth_limit = local_60 + -1;
        this = start;
      } while (uVar10 != 0);
      uVar22 = 0;
    }
LAB_0018a503:
    local_70 = (libtorrent *)((long)start - (long)local_38);
    uVar7 = (ulong)((uint)local_70 & 0x1fffffff);
    local_88 = (bdecode_token)((ulong)local_88 | uVar7);
    for (uVar22 = uVar22 & 0xffffffff; 0 < (int)uVar22; uVar22 = uVar22 - 1) {
      uVar9 = *(uint *)(local_68 + -4 + uVar22 * 4);
      uVar8 = (ulong)(uVar9 & 0x7fffffff);
      pbVar14 = (__return_storage_ptr__->m_tokens).
                super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                .
                super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (((int)uVar9 < 0) && ((SUB84(pbVar14[uVar8],0) & 0xe0000000) == 0x20000000)) {
        local_58 = (bdecode_token)(uVar7 | 0x220000000);
        *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18a575;
        std::
        vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
        ::emplace_back<libtorrent::detail::bdecode_token>
                  ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    *)__return_storage_ptr__,&local_58);
        local_58 = (bdecode_token)(uVar7 | 0xa0000000);
        *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18a584;
        std::
        vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
        ::emplace_back<libtorrent::detail::bdecode_token>
                  ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    *)__return_storage_ptr__,&local_58);
        uVar9 = *(uint *)(local_68 + -4 + uVar22 * 4);
        pbVar14 = (__return_storage_ptr__->m_tokens).
                  super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                  .
                  super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = (ulong)(uVar9 & 0x7fffffff);
      }
      pbVar14[uVar8] =
           (bdecode_token)
           ((ulong)pbVar14[uVar8] & 0xe0000000ffffffff |
           (ulong)(((uint)(*(int *)&(__return_storage_ptr__->m_tokens).
                                    super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                    .
                                    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (int)pbVar14) >> 3)
                   - uVar9 & 0x1fffffff) << 0x20);
      local_58 = local_88;
      *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18a5d6;
      std::
      vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      ::emplace_back<libtorrent::detail::bdecode_token>
                ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                  *)__return_storage_ptr__,&local_58);
    }
    local_58 = (bdecode_token)(uVar7 | 0xa0000000);
    *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x18a5ed;
    std::
    vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>::
    emplace_back<libtorrent::detail::bdecode_token>
              ((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                *)__return_storage_ptr__,&local_58);
    __return_storage_ptr__->m_token_idx = 0;
    __return_storage_ptr__->m_buffer = (char *)local_38;
    __return_storage_ptr__->m_buffer_size = (int)local_70;
    __return_storage_ptr__->m_root_tokens =
         (__return_storage_ptr__->m_tokens).
         super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
         .
         super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    if (ec != (error_code *)0x0) {
      ec->val_ = 0;
    }
    uStack_a0 = 0x189f5b;
    boost::system::error_code::operator=(peVar13,limit_exceeded);
  }
  return __return_storage_ptr__;
}

Assistant:

bdecode_node bdecode(span<char const> buffer
		, error_code& ec, int* error_pos, int depth_limit, int token_limit)
	{
		bdecode_node ret;
		ec.clear();

		if (buffer.size() > bdecode_token::max_offset)
		{
			if (error_pos) *error_pos = 0;
			ec = bdecode_errors::limit_exceeded;
			return ret;
		}

		// this is the stack of bdecode_token indices, into m_tokens.
		// sp is the stack pointer, as index into the array, stack
		int sp = 0;
		TORRENT_ALLOCA(stack, stack_frame, depth_limit);

		// TODO: 2 attempt to simplify this implementation by embracing the span
		char const* start = buffer.data();
		char const* end = start + buffer.size();
		char const* const orig_start = start;

		if (start == end)
			TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);

		while (start <= end)
		{
			if (start >= end) TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);

			if (sp >= depth_limit)
				TORRENT_FAIL_BDECODE(bdecode_errors::depth_exceeded);

			--token_limit;
			if (token_limit < 0)
				TORRENT_FAIL_BDECODE(bdecode_errors::limit_exceeded);

			// look for a new token
			char const t = *start;

			int const current_frame = sp;

			// if we're currently parsing a dictionary, assert that
			// every other node is a string.
			if (current_frame > 0
				&& ret.m_tokens[stack[current_frame - 1].token].type == bdecode_token::dict)
			{
				if (stack[current_frame - 1].state == 0)
				{
					// the current parent is a dict and we are parsing a key.
					// only allow a digit (for a string) or 'e' to terminate
					if (!numeric(t) && t != 'e')
						TORRENT_FAIL_BDECODE(bdecode_errors::expected_digit);
				}
			}

			switch (t)
			{
				case 'd':
					stack[sp++] = stack_frame(int(ret.m_tokens.size()));
					// we push it into the stack so that we know where to fill
					// in the next_node field once we pop this node off the stack.
					// i.e. get to the node following the dictionary in the buffer
					ret.m_tokens.push_back({start - orig_start, bdecode_token::dict});
					++start;
					break;
				case 'l':
					stack[sp++] = stack_frame(int(ret.m_tokens.size()));
					// we push it into the stack so that we know where to fill
					// in the next_node field once we pop this node off the stack.
					// i.e. get to the node following the list in the buffer
					ret.m_tokens.push_back({start - orig_start, bdecode_token::list});
					++start;
					break;
				case 'i':
				{
					char const* const int_start = start;
					bdecode_errors::error_code_enum e = bdecode_errors::no_error;
					// +1 here to point to the first digit, rather than 'i'
					start = check_integer(start + 1, end, e);
					if (e)
					{
						// in order to gracefully terminate the tree,
						// make sure the end of the previous token is set correctly
						if (error_pos) *error_pos = int(start - orig_start);
						error_pos = nullptr;
						start = int_start;
						TORRENT_FAIL_BDECODE(e);
					}
					ret.m_tokens.push_back({int_start - orig_start
						, 1, bdecode_token::integer, 1});
					TORRENT_ASSERT(*start == 'e');

					// skip 'e'
					++start;
					break;
				}
				case 'e':
				{
					// this is the end of a list or dict
					if (sp == 0)
						TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);

					if (sp > 0
						&& ret.m_tokens[stack[sp - 1].token].type == bdecode_token::dict
						&& stack[sp - 1].state == 1)
					{
						// this means we're parsing a dictionary and about to parse a
						// value associated with a key. Instead, we got a termination
						TORRENT_FAIL_BDECODE(bdecode_errors::expected_value);
					}

					// insert the end-of-sequence token
					ret.m_tokens.push_back({start - orig_start, 1, bdecode_token::end});

					// and back-patch the start of this sequence with the offset
					// to the next token we'll insert
					int const top = stack[sp - 1].token;
					// subtract the token's own index, since this is a relative
					// offset
					if (int(ret.m_tokens.size()) - top > bdecode_token::max_next_item)
						TORRENT_FAIL_BDECODE(bdecode_errors::limit_exceeded);

					ret.m_tokens[std::size_t(top)].next_item = std::uint32_t(int(ret.m_tokens.size()) - top);

					// and pop it from the stack.
					TORRENT_ASSERT(sp > 0);
					--sp;
					++start;
					break;
				}
				default:
				{
					// this is the case for strings. The start character is any
					// numeric digit
					if (!numeric(t))
						TORRENT_FAIL_BDECODE(bdecode_errors::expected_value);

					std::int64_t len = t - '0';
					char const* const str_start = start;
					++start;
					if (start >= end) TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);
					bdecode_errors::error_code_enum e = bdecode_errors::no_error;
					start = parse_int(start, end, ':', len, e);
					if (e)
						TORRENT_FAIL_BDECODE(e);
					if (start == end)
						TORRENT_FAIL_BDECODE(bdecode_errors::expected_colon);

					// remaining buffer size excluding ':'
					ptrdiff_t const buff_size = end - start - 1;
					if (len > buff_size)
						TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);
					if (len < 0)
						TORRENT_FAIL_BDECODE(bdecode_errors::overflow);

					// skip ':'
					++start;
					// no need to range check start here
					// the check above ensures that the buffer is long enough to hold
					// the string's length which guarantees that start <= end

					// the bdecode_token only has 8 bits to keep the header size
					// in. If it overflows, fail!
					if (start - str_start - 2 > detail::bdecode_token::max_header)
						TORRENT_FAIL_BDECODE(bdecode_errors::limit_exceeded);

					ret.m_tokens.push_back({str_start - orig_start
						, 1, bdecode_token::string, std::uint8_t(start - str_start)});
					start += len;
					break;
				}
			}

			if (current_frame > 0
				&& ret.m_tokens[stack[current_frame - 1].token].type == bdecode_token::dict)
			{
				// the next item we parse is the opposite
				// state is an unsigned 1-bit member. adding 1 will flip the bit
				stack[current_frame - 1].state = (stack[current_frame - 1].state + 1) & 1;
			}

			// this terminates the top level node, we're done!
			if (sp == 0) break;
		}

done:

		// if parse failed, sp will be greater than 1
		// unwind the stack by inserting terminator to make whatever we have
		// so far valid
		while (sp > 0) {
			TORRENT_ASSERT(ec);
			--sp;

			// we may need to insert a dummy token to properly terminate the tree,
			// in case we just parsed a key to a dict and failed in the value
			if (ret.m_tokens[stack[sp].token].type == bdecode_token::dict
				&& stack[sp].state == 1)
			{
				// insert an empty dictionary as the value
				ret.m_tokens.push_back({start - orig_start, 2, bdecode_token::dict});
				ret.m_tokens.push_back({start - orig_start, bdecode_token::end});
			}

			int const top = stack[sp].token;
			TORRENT_ASSERT(int(ret.m_tokens.size()) - top <= bdecode_token::max_next_item);
			ret.m_tokens[std::size_t(top)].next_item = std::uint32_t(int(ret.m_tokens.size()) - top);
			ret.m_tokens.push_back({start - orig_start, 1, bdecode_token::end});
		}

		ret.m_tokens.push_back({start - orig_start, 0, bdecode_token::end});

		ret.m_token_idx = 0;
		ret.m_buffer = orig_start;
		ret.m_buffer_size = int(start - orig_start);
		ret.m_root_tokens = ret.m_tokens.data();

		return ret;
	}